

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall PClassPlayerPawn::PClassPlayerPawn(PClassPlayerPawn *this)

{
  long lVar1;
  
  PClassActor::PClassActor(&this->super_PClassActor);
  *(undefined ***)
   &(this->super_PClassActor).super_PClass.super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType = &PTR_StaticType_00701b98;
  (this->DisplayName).Chars = FString::NullString.Nothing;
  (this->SoundClass).Chars = FString::NullString.Nothing;
  (this->Face).Chars = FString::NullString.Nothing;
  (this->Portrait).Chars = FString::NullString.Nothing;
  lVar1 = 0x210;
  do {
    *(undefined8 *)
     ((long)&(this->super_PClassActor).super_PClass.super_PNativeStruct.super_PStruct.
             super_PNamedType.super_PCompoundType.super_PType + lVar1) = 0x727dbc;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x260);
  FString::NullString.RefCount = FString::NullString.RefCount + 0xe;
  this->InvulMode = 0;
  this->HealingRadiusType = 0;
  (this->ColorSets).NumUsed = 0;
  TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::SetNodeVector
            (&this->ColorSets,1);
  (this->PainFlashes).NumUsed = 0;
  TMap<FName,_PalEntry,_THashTraits<FName>,_TValueTraits<PalEntry>_>::SetNodeVector
            (&this->PainFlashes,1);
  this->HexenArmor[2] = 0.0;
  this->HexenArmor[3] = 0.0;
  this->HexenArmor[0] = 0.0;
  this->HexenArmor[1] = 0.0;
  this->HexenArmor[4] = 0.0;
  this->ColorRangeStart = '\0';
  this->ColorRangeEnd = '\0';
  return;
}

Assistant:

PClassPlayerPawn::PClassPlayerPawn()
{
	for (size_t i = 0; i < countof(HexenArmor); ++i)
	{
		HexenArmor[i] = 0;
	}
	ColorRangeStart = 0;
	ColorRangeEnd = 0;
}